

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::IFF_Layer2::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IFF_Layer2 *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer pIVar3;
  string local_260 [32];
  __normal_iterator<const_KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_*,_std::vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>_>
  local_240;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IFF_Layer2 *local_18;
  IFF_Layer2 *this_local;
  
  local_18 = this;
  this_local = (IFF_Layer2 *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"IFF Layer 2\n");
  BeamData::GetAsString_abi_cxx11_(&local_1f0,&this->m_BmDt);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
  SecondaryOperationalData::GetAsString_abi_cxx11_((KString *)&citr,&this->m_SOD);
  UTILS::IndentString(&local_210,(KString *)&citr,1,'\t');
  std::operator<<(poVar2,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
            ::begin(&this->m_vFPD);
  local_240._M_current =
       (IFF_ATC_NAVAIDS_FundamentalParameterData *)
       std::
       vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
       ::end(&this->m_vFPD);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_240);
    if (!bVar1) break;
    pIVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_*,_std::vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>_>
             ::operator->(&citrEnd);
    (*(pIVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(local_260);
    std::operator<<(local_190,local_260);
    std::__cxx11::string::~string(local_260);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_*,_std::vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IFF_Layer2::GetAsString() const
{
    KStringStream ss;

    ss << "IFF Layer 2\n"
       << IndentString( m_BmDt.GetAsString(), 1 )
       << IndentString( m_SOD.GetAsString(), 1 );

    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citr = m_vFPD.begin();
    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citrEnd = m_vFPD.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}